

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O1

void __thiscall OpenMD::P2R::writeP2R(P2R *this)

{
  char cVar1;
  ostream *poVar2;
  Revision rev;
  ofstream ofs;
  Revision local_231;
  string local_230;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream
            (&local_210,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"P2R: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"# ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_230,&local_231);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,local_230._M_dataplus._M_p,local_230._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_230,&local_231);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,local_230._M_dataplus._M_p,local_230._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"#nFrames:\t",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_210,this->nProcessed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"#selection1: (",0xe);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_210,(this->selectionScript1_)._M_dataplus._M_p,
                        (this->selectionScript1_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    if (this->doVect_ == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_210,"\tselection2: (",0xe);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_210,(this->selectionScript2_)._M_dataplus._M_p,
                          (this->selectionScript2_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"# parameters: ",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_210,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"#P2 correlation:\n",0x11);
    poVar2 = std::ostream::_M_insert<double>(this->P2_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void P2R::writeP2R() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision rev;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << rev.getFullRevision() << "\n";
      ofs << "# " << rev.getBuildDate() << "\n";
      ofs << "#nFrames:\t" << nProcessed_ << "\n";
      ofs << "#selection1: (" << selectionScript1_ << ")";
      if (!doVect_) { ofs << "\tselection2: (" << selectionScript2_ << ")"; }
      ofs << "\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#P2 correlation:\n";
      ofs << P2_ << "\n";

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "P2R: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }